

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O2

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,Comm *comm,string *configFile,string *ioInConfigFile,
          string hostLanguage)

{
  ADIOS *this_00;
  IO *pIVar1;
  string sStack_48;
  
  std::
  make_shared<adios2::core::ADIOS,std::__cxx11::string_const&,adios2::helper::Comm,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (Comm *)configFile,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm);
  this_00 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__cxx11::string::string((string *)&sStack_48,(string *)ioInConfigFile);
  pIVar1 = ADIOS::DeclareIO(this_00,&sStack_48,Auto);
  std::__cxx11::string::~string((string *)&sStack_48);
  this->m_IO = pIVar1;
  this->m_Engine = (Engine *)0x0;
  std::__cxx11::string::string((string *)&this->m_Name,(string *)name);
  this->m_Mode = mode;
  (this->m_EngineType)._M_dataplus._M_p = (pointer)&(this->m_EngineType).field_2;
  (this->m_EngineType)._M_string_length = 0;
  (this->m_EngineType).field_2._M_local_buf[0] = '\0';
  this->m_FirstStep = true;
  this->m_StepStatus = false;
  if ((mode == ReadRandomAccess) || (mode == Read)) {
    CheckOpen(this);
  }
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, helper::Comm comm,
               const std::string configFile, const std::string ioInConfigFile,
               const std::string hostLanguage)
: m_ADIOS(std::make_shared<ADIOS>(configFile, std::move(comm), hostLanguage)),
  m_IO(&m_ADIOS->DeclareIO(ioInConfigFile)), m_Name(name), m_Mode(mode)
{
    if ((mode == adios2::Mode::Read) || (mode == adios2::Mode::ReadRandomAccess))
    {
        CheckOpen();
    }
}